

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_7.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::draft7::
schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::schema_validator_factory_7
          (schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch,
          validator_factory_factory_type *factory_factory,evaluation_options *options,
          schema_store_type *schema_store_ptr,
          vector<std::function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
          *resolve_funcs)

{
  evaluation_options *in_RCX;
  string *in_RDX;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RSI;
  schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *ctx;
  schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RDI;
  validator_factory_factory_type *in_R8;
  evaluation_options *in_R9;
  vector<std::function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
  *unaff_retaddr;
  evaluation_options *in_stack_ffffffffffffff20;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff58;
  keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff60;
  string local_50 [24];
  schema_store_type *in_stack_ffffffffffffffc8;
  evaluation_options *root_schema;
  
  root_schema = in_RCX;
  schema_version::draft7_abi_cxx11_();
  evaluation_options::evaluation_options((evaluation_options *)in_RSI,in_RCX);
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::schema_validator_factory_base
            (in_RSI,in_RDX,
             (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             root_schema,in_R8,in_R9,in_stack_ffffffffffffffc8,unaff_retaddr);
  evaluation_options::~evaluation_options(in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_50);
  (in_RDI->
  super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  )._vptr_schema_validator_factory_base = (_func_int **)&PTR__schema_validator_factory_7_01346128;
  std::unordered_map<$e074f57c$>::unordered_map((unordered_map<_e074f57c_> *)0x7ba351);
  ctx = in_RDI;
  keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::keyword_validator_factory(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  init(in_RDI,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

schema_validator_factory_7(Json&& sch, const validator_factory_factory_type& factory_factory, 
            evaluation_options options, schema_store_type* schema_store_ptr,
            const std::vector<resolve_uri_type<Json>>& resolve_funcs) 
            : schema_validator_factory_base<Json>(schema_version::draft7(), std::move(sch), factory_factory, options, schema_store_ptr, resolve_funcs),
              factory_(this)
        {
            init();
        }